

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.c
# Opt level: O3

void writeParticle(particle *parts,int partcount,int n)

{
  FILE *__s;
  undefined4 in_register_00000014;
  long lVar1;
  char fileName [128];
  char acStack_b8 [136];
  
  if (partcount != 0 && parts != (particle *)0x0) {
    sprintf(acStack_b8,"ParticleField_%i.vtk",CONCAT44(in_register_00000014,n));
    __s = fopen(acStack_b8,"w");
    if (__s != (FILE *)0x0) {
      fwrite("# vtk DataFile Version 3.0\n",0x1b,1,__s);
      fwrite("Partikel\n",9,1,__s);
      fwrite("ASCII\n",6,1,__s);
      fwrite("DATASET POLYDATA\n",0x11,1,__s);
      fprintf(__s,"POINTS %i double\n",(ulong)(uint)partcount);
      if (0 < partcount) {
        lVar1 = 0;
        do {
          if (((&parts->field_0x20)[lVar1] & 1) == 0) {
            fwrite("0.1 0.1 -0.1\n",0xd,1,__s);
          }
          else {
            fprintf(__s,"%e %e 0.0\n",*(undefined8 *)((long)&parts->x + lVar1),
                    *(undefined8 *)((long)&parts->y + lVar1));
          }
          lVar1 = lVar1 + 0x28;
        } while ((ulong)(uint)partcount * 0x28 != lVar1);
      }
      fclose(__s);
    }
  }
  return;
}

Assistant:

void writeParticle (particle *parts, int partcount, int n)
{
	if (!parts|| !partcount)
		return;
	char fileName[128];
	sprintf(fileName, "ParticleField_%i.vtk",n);
	FILE *out = fopen(fileName,"w");
	if (out == NULL)
		return;
	fprintf(out,"# vtk DataFile Version 3.0\n");
	fprintf(out,"Partikel\n");
	fprintf(out,"ASCII\n");

	fprintf(out,"DATASET POLYDATA\n");
	fprintf(out,"POINTS %i double\n",partcount);
	for (int p = 0; p < partcount; p++)
	{
		if (!parts[p].onScreen)
			fprintf(out,"0.1 0.1 -0.1\n");
		else
			fprintf(out,"%e %e 0.0\n",parts[p].x,parts[p].y);
	}
	fclose(out);
}